

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

ssize_t __thiscall
fmt::v7::detail::
arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>::
write(arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
      *this,int __fd,void *__buf,size_t __n)

{
  back_insert_iterator<fmt::v7::detail::buffer<char>_> bVar1;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> bVar2;
  char *begin;
  buffer<char> *extraout_RAX;
  basic_format_specs<char> *in_R8;
  basic_string_view<char> s;
  
  if (this->specs_ == (format_specs *)0x0) {
    begin = "false";
    if ((char)__fd != '\0') {
      begin = "true";
    }
    bVar1.container =
         (this->out_).super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
    buffer<char>::append<char>(bVar1.container,begin,begin + ((ulong)(uint)__fd & 0xff ^ 5));
    bVar2.container = extraout_RAX;
  }
  else {
    bVar1.container = (buffer<char> *)0x4e88b0;
    if ((char)__fd != '\0') {
      bVar1.container = (buffer<char> *)0x58580d;
    }
    s.data_ = (char *)((ulong)(uint)__fd & 0xff ^ 5);
    s.size_ = (size_t)this->specs_;
    bVar2.container =
         (buffer<char> *)
         write<char,char,fmt::v7::detail::buffer_appender<char>>
                   ((this->out_).super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                    container,bVar1.container,s,in_R8);
    bVar1.container = bVar2.container;
  }
  (this->out_).super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container =
       bVar1.container;
  return (ssize_t)bVar2.container;
}

Assistant:

void write(bool value) {
    if (specs_)
      write(string_view(value ? "true" : "false"), *specs_);
    else
      out_ = detail::write<Char>(out_, value);
  }